

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall CoreML::Specification::CropLayerParams::Clear(CropLayerParams *this)

{
  (this->offset_).current_size_ = 0;
  if (this->cropamounts_ != (BorderAmounts *)0x0) {
    (*(this->cropamounts_->super_MessageLite)._vptr_MessageLite[1])();
  }
  this->cropamounts_ = (BorderAmounts *)0x0;
  return;
}

Assistant:

void CropLayerParams::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.CropLayerParams)
  offset_.Clear();
  if (GetArenaNoVirtual() == NULL && cropamounts_ != NULL) {
    delete cropamounts_;
  }
  cropamounts_ = NULL;
}